

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float fVar19;
  byte bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  AABBNodeMB4D *node1;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  size_t sVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  UVIdentity<4> mapUV;
  undefined1 local_1518 [16];
  long local_1500;
  ulong local_14f8;
  NodeRef *local_14f0;
  long local_14e8;
  undefined1 (*local_14e0) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  UVIdentity<4> *local_1448;
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  RTCHitN local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined4 local_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  uint local_1358;
  uint uStack_1354;
  uint uStack_1350;
  uint uStack_134c;
  uint uStack_1348;
  uint uStack_1344;
  uint uStack_1340;
  uint uStack_133c;
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_14f0 = stack + 1;
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar84 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar92 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar97 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  local_12b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1258 = local_12b8 * 0.99999964;
  local_1278 = local_12d8 * 0.99999964;
  local_1298 = local_12f8 * 0.99999964;
  local_12b8 = local_12b8 * 1.0000004;
  local_12d8 = local_12d8 * 1.0000004;
  local_12f8 = local_12f8 * 1.0000004;
  local_14f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = local_14f8 ^ 0x20;
  iVar3 = (tray->tnear).field_0.i[k];
  auVar112 = ZEXT3264(CONCAT428(iVar3,CONCAT424(iVar3,CONCAT420(iVar3,CONCAT416(iVar3,CONCAT412(
                                                  iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))))))));
  iVar3 = (tray->tfar).field_0.i[k];
  auVar117 = ZEXT3264(CONCAT428(iVar3,CONCAT424(iVar3,CONCAT420(iVar3,CONCAT416(iVar3,CONCAT412(
                                                  iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))))))));
  local_14e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar46 = true;
  fStack_1254 = local_1258;
  fStack_1250 = local_1258;
  fStack_124c = local_1258;
  fStack_1248 = local_1258;
  fStack_1244 = local_1258;
  fStack_1240 = local_1258;
  fStack_123c = local_1258;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  fStack_12b4 = local_12b8;
  fStack_12b0 = local_12b8;
  fStack_12ac = local_12b8;
  fStack_12a8 = local_12b8;
  fStack_12a4 = local_12b8;
  fStack_12a0 = local_12b8;
  fStack_129c = local_12b8;
  fStack_12d4 = local_12d8;
  fStack_12d0 = local_12d8;
  fStack_12cc = local_12d8;
  fStack_12c8 = local_12d8;
  fStack_12c4 = local_12d8;
  fStack_12c0 = local_12d8;
  fStack_12bc = local_12d8;
  fStack_12f4 = local_12f8;
  fStack_12f0 = local_12f8;
  fStack_12ec = local_12f8;
  fStack_12e8 = local_12f8;
  fStack_12e4 = local_12f8;
  fStack_12e0 = local_12f8;
  fStack_12dc = local_12f8;
  do {
    sVar42 = local_14f0[-1].ptr;
    local_14f0 = local_14f0 + -1;
    while( true ) {
      local_11f8 = auVar84._0_32_;
      local_1218 = auVar92._0_32_;
      local_1238 = auVar97._0_32_;
      if ((sVar42 & 8) != 0) break;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar53._4_4_ = uVar2;
      auVar53._0_4_ = uVar2;
      auVar53._8_4_ = uVar2;
      auVar53._12_4_ = uVar2;
      auVar53._16_4_ = uVar2;
      auVar53._20_4_ = uVar2;
      auVar53._24_4_ = uVar2;
      auVar53._28_4_ = uVar2;
      uVar25 = sVar42 & 0xfffffffffffffff0;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + local_14f8),auVar53,
                                *(undefined1 (*) [32])(uVar25 + 0x40 + local_14f8));
      auVar16 = vsubps_avx(ZEXT1632(auVar47),local_11f8);
      auVar17._4_4_ = fStack_1254 * auVar16._4_4_;
      auVar17._0_4_ = local_1258 * auVar16._0_4_;
      auVar17._8_4_ = fStack_1250 * auVar16._8_4_;
      auVar17._12_4_ = fStack_124c * auVar16._12_4_;
      auVar17._16_4_ = fStack_1248 * auVar16._16_4_;
      auVar17._20_4_ = fStack_1244 * auVar16._20_4_;
      auVar17._24_4_ = fStack_1240 * auVar16._24_4_;
      auVar17._28_4_ = auVar16._28_4_;
      auVar16 = vmaxps_avx(auVar112._0_32_,auVar17);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar32),auVar53,
                                *(undefined1 (*) [32])(uVar25 + 0x40 + uVar32));
      auVar17 = vsubps_avx(ZEXT1632(auVar47),local_1218);
      auVar18._4_4_ = fStack_1274 * auVar17._4_4_;
      auVar18._0_4_ = local_1278 * auVar17._0_4_;
      auVar18._8_4_ = fStack_1270 * auVar17._8_4_;
      auVar18._12_4_ = fStack_126c * auVar17._12_4_;
      auVar18._16_4_ = fStack_1268 * auVar17._16_4_;
      auVar18._20_4_ = fStack_1264 * auVar17._20_4_;
      auVar18._24_4_ = fStack_1260 * auVar17._24_4_;
      auVar18._28_4_ = auVar17._28_4_;
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar43),auVar53,
                                *(undefined1 (*) [32])(uVar25 + 0x40 + uVar43));
      auVar17 = vsubps_avx(ZEXT1632(auVar47),local_1238);
      auVar21._4_4_ = fStack_1294 * auVar17._4_4_;
      auVar21._0_4_ = local_1298 * auVar17._0_4_;
      auVar21._8_4_ = fStack_1290 * auVar17._8_4_;
      auVar21._12_4_ = fStack_128c * auVar17._12_4_;
      auVar21._16_4_ = fStack_1288 * auVar17._16_4_;
      auVar21._20_4_ = fStack_1284 * auVar17._20_4_;
      auVar21._24_4_ = fStack_1280 * auVar17._24_4_;
      auVar21._28_4_ = auVar17._28_4_;
      auVar17 = vmaxps_avx(auVar18,auVar21);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar44),auVar53,
                                *(undefined1 (*) [32])(uVar25 + 0x40 + uVar44));
      auVar17 = vsubps_avx(ZEXT1632(auVar47),local_11f8);
      auVar22._4_4_ = fStack_12b4 * auVar17._4_4_;
      auVar22._0_4_ = local_12b8 * auVar17._0_4_;
      auVar22._8_4_ = fStack_12b0 * auVar17._8_4_;
      auVar22._12_4_ = fStack_12ac * auVar17._12_4_;
      auVar22._16_4_ = fStack_12a8 * auVar17._16_4_;
      auVar22._20_4_ = fStack_12a4 * auVar17._20_4_;
      auVar22._24_4_ = fStack_12a0 * auVar17._24_4_;
      auVar22._28_4_ = auVar17._28_4_;
      auVar17 = vminps_avx(auVar117._0_32_,auVar22);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar32 ^ 0x20)),auVar53,
                                *(undefined1 (*) [32])(uVar25 + 0x40 + (uVar32 ^ 0x20)));
      auVar18 = vsubps_avx(ZEXT1632(auVar47),local_1218);
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar43 ^ 0x20)),auVar53,
                                *(undefined1 (*) [32])(uVar25 + 0x40 + (uVar43 ^ 0x20)));
      auVar23._4_4_ = fStack_12d4 * auVar18._4_4_;
      auVar23._0_4_ = local_12d8 * auVar18._0_4_;
      auVar23._8_4_ = fStack_12d0 * auVar18._8_4_;
      auVar23._12_4_ = fStack_12cc * auVar18._12_4_;
      auVar23._16_4_ = fStack_12c8 * auVar18._16_4_;
      auVar23._20_4_ = fStack_12c4 * auVar18._20_4_;
      auVar23._24_4_ = fStack_12c0 * auVar18._24_4_;
      auVar23._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(ZEXT1632(auVar47),local_1238);
      auVar24._4_4_ = fStack_12f4 * auVar18._4_4_;
      auVar24._0_4_ = local_12f8 * auVar18._0_4_;
      auVar24._8_4_ = fStack_12f0 * auVar18._8_4_;
      auVar24._12_4_ = fStack_12ec * auVar18._12_4_;
      auVar24._16_4_ = fStack_12e8 * auVar18._16_4_;
      auVar24._20_4_ = fStack_12e4 * auVar18._20_4_;
      auVar24._24_4_ = fStack_12e0 * auVar18._24_4_;
      auVar24._28_4_ = auVar18._28_4_;
      auVar18 = vminps_avx(auVar23,auVar24);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar16 = vcmpps_avx(auVar16,auVar17,2);
      if (((uint)sVar42 & 7) == 6) {
        auVar17 = vcmpps_avx(*(undefined1 (*) [32])(uVar25 + 0x1c0),auVar53,2);
        auVar18 = vcmpps_avx(auVar53,*(undefined1 (*) [32])(uVar25 + 0x1e0),1);
        auVar17 = vandps_avx(auVar17,auVar18);
        auVar16 = vandps_avx(auVar17,auVar16);
        auVar47 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
      }
      else {
        auVar47 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
      }
      auVar47 = vpsllw_avx(auVar47,0xf);
      if ((((((((auVar47 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar47 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar47 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar47 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar47[0xf])
      goto LAB_005d37ae;
      auVar47 = vpacksswb_avx(auVar47,auVar47);
      bVar20 = SUB161(auVar47 >> 7,0) & 1 | (SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar47 >> 0x17,0) & 1) << 2 | (SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar47 >> 0x27,0) & 1) << 4 | (SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar47 >> 0x37,0) & 1) << 6 | SUB161(auVar47 >> 0x3f,0) << 7;
      lVar31 = 0;
      for (uVar27 = (ulong)bVar20; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      sVar42 = *(size_t *)(uVar25 + lVar31 * 8);
      uVar26 = bVar20 - 1 & (uint)bVar20;
      uVar27 = (ulong)uVar26;
      if (uVar26 != 0) {
        local_14f0->ptr = sVar42;
        lVar31 = 0;
        for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          lVar31 = lVar31 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar27 = (ulong)uVar26;
        bVar45 = uVar26 == 0;
        while( true ) {
          local_14f0 = local_14f0 + 1;
          sVar42 = *(size_t *)(uVar25 + lVar31 * 8);
          if (bVar45) break;
          local_14f0->ptr = sVar42;
          lVar31 = 0;
          for (uVar29 = uVar27; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar27 = uVar27 - 1 & uVar27;
          bVar45 = uVar27 == 0;
        }
      }
    }
    local_1500 = (ulong)((uint)sVar42 & 0xf) - 8;
    if (local_1500 != 0) {
      uVar25 = sVar42 & 0xfffffffffffffff0;
      local_14e8 = 0;
      local_1318 = auVar112._0_32_;
      local_1338 = auVar117._0_32_;
      do {
        lVar40 = local_14e8 * 0x50;
        pSVar6 = context->scene;
        pGVar7 = (pSVar6->geometries).items[*(uint *)(uVar25 + 0x30 + lVar40)].ptr;
        fVar4 = (pGVar7->time_range).lower;
        fVar4 = pGVar7->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar4) / ((pGVar7->time_range).upper - fVar4));
        auVar47 = vroundss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),9);
        auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
        auVar74 = vmaxss_avx(ZEXT816(0),auVar47);
        lVar28 = (long)(int)auVar74._0_4_ * 0x38;
        uVar41 = (ulong)*(uint *)(uVar25 + 4 + lVar40);
        lVar31 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar28);
        lVar28 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar28);
        auVar47 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar25 + lVar40) * 4);
        uVar33 = (ulong)*(uint *)(uVar25 + 0x10 + lVar40);
        auVar87 = *(undefined1 (*) [16])(lVar31 + uVar33 * 4);
        uVar34 = (ulong)*(uint *)(uVar25 + 0x20 + lVar40);
        auVar50 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
        auVar62 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
        uVar35 = (ulong)*(uint *)(uVar25 + 0x14 + lVar40);
        auVar54 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
        uVar36 = (ulong)*(uint *)(uVar25 + 0x24 + lVar40);
        auVar55 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
        uVar37 = (ulong)*(uint *)(uVar25 + 8 + lVar40);
        auVar60 = *(undefined1 (*) [16])(lVar31 + uVar37 * 4);
        uVar27 = (ulong)*(uint *)(uVar25 + 0x18 + lVar40);
        auVar63 = *(undefined1 (*) [16])(lVar31 + uVar27 * 4);
        uVar38 = (ulong)*(uint *)(uVar25 + 0x28 + lVar40);
        auVar71 = *(undefined1 (*) [16])(lVar31 + uVar38 * 4);
        uVar39 = (ulong)*(uint *)(uVar25 + 0xc + lVar40);
        auVar72 = *(undefined1 (*) [16])(lVar31 + uVar39 * 4);
        uVar29 = (ulong)*(uint *)(uVar25 + 0x1c + lVar40);
        auVar57 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
        uVar30 = (ulong)*(uint *)(uVar25 + 0x2c + lVar40);
        auVar83 = *(undefined1 (*) [16])(lVar31 + uVar30 * 4);
        auVar91 = *(undefined1 (*) [16])(lVar28 + (ulong)*(uint *)(uVar25 + lVar40) * 4);
        auVar98 = *(undefined1 (*) [16])(lVar28 + uVar33 * 4);
        fVar4 = fVar4 - auVar74._0_4_;
        auVar74 = vunpcklps_avx(auVar47,auVar60);
        auVar60 = vunpckhps_avx(auVar47,auVar60);
        auVar68 = vunpcklps_avx(auVar62,auVar72);
        auVar62 = vunpckhps_avx(auVar62,auVar72);
        auVar47 = *(undefined1 (*) [16])(lVar28 + uVar41 * 4);
        auVar48 = vunpcklps_avx(auVar60,auVar62);
        auVar49 = vunpcklps_avx(auVar74,auVar68);
        auVar60 = vunpckhps_avx(auVar74,auVar68);
        auVar72 = vunpcklps_avx(auVar87,auVar63);
        auVar62 = vunpckhps_avx(auVar87,auVar63);
        auVar63 = vunpcklps_avx(auVar54,auVar57);
        auVar54 = vunpckhps_avx(auVar54,auVar57);
        auVar87 = *(undefined1 (*) [16])(lVar28 + uVar37 * 4);
        auVar57 = vunpcklps_avx(auVar62,auVar54);
        auVar74 = vunpcklps_avx(auVar72,auVar63);
        auVar54 = vunpckhps_avx(auVar72,auVar63);
        auVar72 = vunpcklps_avx(auVar50,auVar71);
        auVar63 = vunpckhps_avx(auVar50,auVar71);
        auVar68 = vunpcklps_avx(auVar55,auVar83);
        auVar71 = vunpckhps_avx(auVar55,auVar83);
        auVar62 = *(undefined1 (*) [16])(lVar28 + uVar39 * 4);
        auVar83 = vunpcklps_avx(auVar63,auVar71);
        auVar50 = vunpcklps_avx(auVar72,auVar68);
        auVar63 = vunpckhps_avx(auVar72,auVar68);
        auVar71 = vunpcklps_avx(auVar91,auVar87);
        auVar87 = vunpckhps_avx(auVar91,auVar87);
        auVar72 = vunpcklps_avx(auVar47,auVar62);
        auVar62 = vunpckhps_avx(auVar47,auVar62);
        auVar47 = *(undefined1 (*) [16])(lVar28 + uVar27 * 4);
        auVar91 = vunpcklps_avx(auVar87,auVar62);
        auVar68 = vunpcklps_avx(auVar71,auVar72);
        auVar62 = vunpckhps_avx(auVar71,auVar72);
        auVar72 = vunpcklps_avx(auVar98,auVar47);
        auVar71 = vunpckhps_avx(auVar98,auVar47);
        auVar47 = *(undefined1 (*) [16])(lVar28 + uVar35 * 4);
        auVar87 = *(undefined1 (*) [16])(lVar28 + uVar29 * 4);
        auVar98 = vunpcklps_avx(auVar47,auVar87);
        auVar47 = vunpckhps_avx(auVar47,auVar87);
        auVar55 = vunpcklps_avx(auVar71,auVar47);
        auVar56 = vunpcklps_avx(auVar72,auVar98);
        auVar71 = vunpckhps_avx(auVar72,auVar98);
        auVar47 = *(undefined1 (*) [16])(lVar28 + uVar34 * 4);
        auVar87 = *(undefined1 (*) [16])(lVar28 + uVar38 * 4);
        auVar98 = vunpcklps_avx(auVar47,auVar87);
        auVar72 = vunpckhps_avx(auVar47,auVar87);
        auVar47 = *(undefined1 (*) [16])(lVar28 + uVar36 * 4);
        auVar87 = *(undefined1 (*) [16])(lVar28 + uVar30 * 4);
        auVar61 = vunpcklps_avx(auVar47,auVar87);
        auVar47 = vunpckhps_avx(auVar47,auVar87);
        auVar87 = vunpcklps_avx(auVar72,auVar47);
        auVar72 = vunpcklps_avx(auVar98,auVar61);
        auVar47 = vunpckhps_avx(auVar98,auVar61);
        fVar19 = 1.0 - fVar4;
        auVar104._4_4_ = fVar19;
        auVar104._0_4_ = fVar19;
        auVar104._8_4_ = fVar19;
        auVar104._12_4_ = fVar19;
        auVar98._0_4_ = fVar4 * auVar68._0_4_;
        auVar98._4_4_ = fVar4 * auVar68._4_4_;
        auVar98._8_4_ = fVar4 * auVar68._8_4_;
        auVar98._12_4_ = fVar4 * auVar68._12_4_;
        auVar98 = vfmadd231ps_fma(auVar98,auVar104,auVar49);
        auVar85._0_4_ = fVar4 * auVar62._0_4_;
        auVar85._4_4_ = fVar4 * auVar62._4_4_;
        auVar85._8_4_ = fVar4 * auVar62._8_4_;
        auVar85._12_4_ = fVar4 * auVar62._12_4_;
        auVar62 = vfmadd231ps_fma(auVar85,auVar104,auVar60);
        auVar93._0_4_ = fVar4 * auVar91._0_4_;
        auVar93._4_4_ = fVar4 * auVar91._4_4_;
        auVar93._8_4_ = fVar4 * auVar91._8_4_;
        auVar93._12_4_ = fVar4 * auVar91._12_4_;
        auVar91 = vfmadd231ps_fma(auVar93,auVar104,auVar48);
        auVar99._0_4_ = fVar4 * auVar56._0_4_;
        auVar99._4_4_ = fVar4 * auVar56._4_4_;
        auVar99._8_4_ = fVar4 * auVar56._8_4_;
        auVar99._12_4_ = fVar4 * auVar56._12_4_;
        auVar74 = vfmadd231ps_fma(auVar99,auVar104,auVar74);
        auVar73._0_4_ = fVar4 * auVar71._0_4_;
        auVar73._4_4_ = fVar4 * auVar71._4_4_;
        auVar73._8_4_ = fVar4 * auVar71._8_4_;
        auVar73._12_4_ = fVar4 * auVar71._12_4_;
        auVar71 = vfmadd231ps_fma(auVar73,auVar104,auVar54);
        puVar1 = (undefined8 *)(uVar25 + 0x30 + lVar40);
        local_1488 = *puVar1;
        uStack_1480 = puVar1[1];
        puVar1 = (undefined8 *)(uVar25 + 0x40 + lVar40);
        auVar54._0_4_ = fVar4 * auVar55._0_4_;
        auVar54._4_4_ = fVar4 * auVar55._4_4_;
        auVar54._8_4_ = fVar4 * auVar55._8_4_;
        auVar54._12_4_ = fVar4 * auVar55._12_4_;
        auVar57 = vfmadd231ps_fma(auVar54,auVar104,auVar57);
        auVar60._0_4_ = fVar4 * auVar72._0_4_;
        auVar60._4_4_ = fVar4 * auVar72._4_4_;
        auVar60._8_4_ = fVar4 * auVar72._8_4_;
        auVar60._12_4_ = fVar4 * auVar72._12_4_;
        auVar68._0_4_ = fVar4 * auVar47._0_4_;
        auVar68._4_4_ = fVar4 * auVar47._4_4_;
        auVar68._8_4_ = fVar4 * auVar47._8_4_;
        auVar68._12_4_ = fVar4 * auVar47._12_4_;
        auVar79._0_4_ = fVar4 * auVar87._0_4_;
        auVar79._4_4_ = fVar4 * auVar87._4_4_;
        auVar79._8_4_ = fVar4 * auVar87._8_4_;
        auVar79._12_4_ = fVar4 * auVar87._12_4_;
        auVar72 = vfmadd231ps_fma(auVar60,auVar104,auVar50);
        auVar68 = vfmadd231ps_fma(auVar68,auVar104,auVar63);
        auVar83 = vfmadd231ps_fma(auVar79,auVar104,auVar83);
        local_1498 = *puVar1;
        uStack_1490 = puVar1[1];
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar48._4_4_ = uVar2;
        auVar48._0_4_ = uVar2;
        auVar48._8_4_ = uVar2;
        auVar48._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar103._4_4_ = uVar2;
        auVar103._0_4_ = uVar2;
        auVar103._8_4_ = uVar2;
        auVar103._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar106._4_4_ = uVar2;
        auVar106._0_4_ = uVar2;
        auVar106._8_4_ = uVar2;
        auVar106._12_4_ = uVar2;
        auVar54 = vsubps_avx(auVar98,auVar48);
        auVar60 = vsubps_avx(auVar62,auVar103);
        auVar47 = vsubps_avx(auVar91,auVar106);
        auVar87 = vsubps_avx(auVar74,auVar48);
        auVar62 = vsubps_avx(auVar71,auVar103);
        auVar63 = vsubps_avx(auVar57,auVar106);
        auVar71 = vsubps_avx(auVar72,auVar48);
        auVar72 = vsubps_avx(auVar68,auVar103);
        auVar57 = vsubps_avx(auVar83,auVar106);
        auVar83 = vsubps_avx(auVar71,auVar54);
        auVar91 = vsubps_avx(auVar72,auVar60);
        auVar98 = vsubps_avx(auVar57,auVar47);
        auVar49._0_4_ = auVar54._0_4_ + auVar71._0_4_;
        auVar49._4_4_ = auVar54._4_4_ + auVar71._4_4_;
        auVar49._8_4_ = auVar54._8_4_ + auVar71._8_4_;
        auVar49._12_4_ = auVar54._12_4_ + auVar71._12_4_;
        auVar69._0_4_ = auVar72._0_4_ + auVar60._0_4_;
        auVar69._4_4_ = auVar72._4_4_ + auVar60._4_4_;
        auVar69._8_4_ = auVar72._8_4_ + auVar60._8_4_;
        auVar69._12_4_ = auVar72._12_4_ + auVar60._12_4_;
        fVar19 = auVar47._0_4_;
        auVar74._0_4_ = auVar57._0_4_ + fVar19;
        fVar9 = auVar47._4_4_;
        auVar74._4_4_ = auVar57._4_4_ + fVar9;
        fVar10 = auVar47._8_4_;
        auVar74._8_4_ = auVar57._8_4_ + fVar10;
        fVar11 = auVar47._12_4_;
        auVar74._12_4_ = auVar57._12_4_ + fVar11;
        auVar107._0_4_ = auVar98._0_4_ * auVar69._0_4_;
        auVar107._4_4_ = auVar98._4_4_ * auVar69._4_4_;
        auVar107._8_4_ = auVar98._8_4_ * auVar69._8_4_;
        auVar107._12_4_ = auVar98._12_4_ * auVar69._12_4_;
        auVar68 = vfmsub231ps_fma(auVar107,auVar91,auVar74);
        auVar75._0_4_ = auVar83._0_4_ * auVar74._0_4_;
        auVar75._4_4_ = auVar83._4_4_ * auVar74._4_4_;
        auVar75._8_4_ = auVar83._8_4_ * auVar74._8_4_;
        auVar75._12_4_ = auVar83._12_4_ * auVar74._12_4_;
        auVar74 = vfmsub231ps_fma(auVar75,auVar98,auVar49);
        auVar50._0_4_ = auVar91._0_4_ * auVar49._0_4_;
        auVar50._4_4_ = auVar91._4_4_ * auVar49._4_4_;
        auVar50._8_4_ = auVar91._8_4_ * auVar49._8_4_;
        auVar50._12_4_ = auVar91._12_4_ * auVar49._12_4_;
        auVar48 = vfmsub231ps_fma(auVar50,auVar83,auVar69);
        fVar4 = *(float *)(ray + k * 4 + 0x60);
        auVar70._0_4_ = fVar4 * auVar48._0_4_;
        auVar70._4_4_ = fVar4 * auVar48._4_4_;
        auVar70._8_4_ = fVar4 * auVar48._8_4_;
        auVar70._12_4_ = fVar4 * auVar48._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar116._4_4_ = uVar2;
        auVar116._0_4_ = uVar2;
        auVar116._8_4_ = uVar2;
        auVar116._12_4_ = uVar2;
        auVar74 = vfmadd231ps_fma(auVar70,auVar116,auVar74);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar100._4_4_ = uVar2;
        auVar100._0_4_ = uVar2;
        auVar100._8_4_ = uVar2;
        auVar100._12_4_ = uVar2;
        auVar50 = vfmadd231ps_fma(auVar74,auVar100,auVar68);
        auVar74 = vsubps_avx(auVar60,auVar62);
        auVar68 = vsubps_avx(auVar47,auVar63);
        auVar55._0_4_ = auVar60._0_4_ + auVar62._0_4_;
        auVar55._4_4_ = auVar60._4_4_ + auVar62._4_4_;
        auVar55._8_4_ = auVar60._8_4_ + auVar62._8_4_;
        auVar55._12_4_ = auVar60._12_4_ + auVar62._12_4_;
        auVar47._0_4_ = auVar63._0_4_ + fVar19;
        auVar47._4_4_ = auVar63._4_4_ + fVar9;
        auVar47._8_4_ = auVar63._8_4_ + fVar10;
        auVar47._12_4_ = auVar63._12_4_ + fVar11;
        fVar12 = auVar68._0_4_;
        auVar86._0_4_ = auVar55._0_4_ * fVar12;
        fVar13 = auVar68._4_4_;
        auVar86._4_4_ = auVar55._4_4_ * fVar13;
        fVar14 = auVar68._8_4_;
        auVar86._8_4_ = auVar55._8_4_ * fVar14;
        fVar15 = auVar68._12_4_;
        auVar86._12_4_ = auVar55._12_4_ * fVar15;
        auVar49 = vfmsub231ps_fma(auVar86,auVar74,auVar47);
        auVar48 = vsubps_avx(auVar54,auVar87);
        fVar105 = auVar48._0_4_;
        auVar94._0_4_ = fVar105 * auVar47._0_4_;
        fVar108 = auVar48._4_4_;
        auVar94._4_4_ = fVar108 * auVar47._4_4_;
        fVar109 = auVar48._8_4_;
        auVar94._8_4_ = fVar109 * auVar47._8_4_;
        fVar110 = auVar48._12_4_;
        auVar94._12_4_ = fVar110 * auVar47._12_4_;
        auVar76._0_4_ = auVar54._0_4_ + auVar87._0_4_;
        auVar76._4_4_ = auVar54._4_4_ + auVar87._4_4_;
        auVar76._8_4_ = auVar54._8_4_ + auVar87._8_4_;
        auVar76._12_4_ = auVar54._12_4_ + auVar87._12_4_;
        auVar47 = vfmsub231ps_fma(auVar94,auVar68,auVar76);
        fVar111 = auVar74._0_4_;
        auVar77._0_4_ = fVar111 * auVar76._0_4_;
        fVar113 = auVar74._4_4_;
        auVar77._4_4_ = fVar113 * auVar76._4_4_;
        fVar114 = auVar74._8_4_;
        auVar77._8_4_ = fVar114 * auVar76._8_4_;
        fVar115 = auVar74._12_4_;
        auVar77._12_4_ = fVar115 * auVar76._12_4_;
        auVar55 = vfmsub231ps_fma(auVar77,auVar48,auVar55);
        auVar78._0_4_ = fVar4 * auVar55._0_4_;
        auVar78._4_4_ = fVar4 * auVar55._4_4_;
        auVar78._8_4_ = fVar4 * auVar55._8_4_;
        auVar78._12_4_ = fVar4 * auVar55._12_4_;
        auVar47 = vfmadd231ps_fma(auVar78,auVar116,auVar47);
        local_1468 = vfmadd231ps_fma(auVar47,auVar100,auVar49);
        auVar49 = vsubps_avx(auVar87,auVar71);
        auVar61._0_4_ = auVar87._0_4_ + auVar71._0_4_;
        auVar61._4_4_ = auVar87._4_4_ + auVar71._4_4_;
        auVar61._8_4_ = auVar87._8_4_ + auVar71._8_4_;
        auVar61._12_4_ = auVar87._12_4_ + auVar71._12_4_;
        auVar71 = vsubps_avx(auVar62,auVar72);
        auVar56._0_4_ = auVar72._0_4_ + auVar62._0_4_;
        auVar56._4_4_ = auVar72._4_4_ + auVar62._4_4_;
        auVar56._8_4_ = auVar72._8_4_ + auVar62._8_4_;
        auVar56._12_4_ = auVar72._12_4_ + auVar62._12_4_;
        auVar72 = vsubps_avx(auVar63,auVar57);
        auVar80._0_4_ = auVar63._0_4_ + auVar57._0_4_;
        auVar80._4_4_ = auVar63._4_4_ + auVar57._4_4_;
        auVar80._8_4_ = auVar63._8_4_ + auVar57._8_4_;
        auVar80._12_4_ = auVar63._12_4_ + auVar57._12_4_;
        auVar87._0_4_ = auVar72._0_4_ * auVar56._0_4_;
        auVar87._4_4_ = auVar72._4_4_ * auVar56._4_4_;
        auVar87._8_4_ = auVar72._8_4_ * auVar56._8_4_;
        auVar87._12_4_ = auVar72._12_4_ * auVar56._12_4_;
        auVar87 = vfmsub231ps_fma(auVar87,auVar71,auVar80);
        auVar81._0_4_ = auVar80._0_4_ * auVar49._0_4_;
        auVar81._4_4_ = auVar80._4_4_ * auVar49._4_4_;
        auVar81._8_4_ = auVar80._8_4_ * auVar49._8_4_;
        auVar81._12_4_ = auVar80._12_4_ * auVar49._12_4_;
        auVar47 = vfmsub231ps_fma(auVar81,auVar72,auVar61);
        auVar62._0_4_ = auVar71._0_4_ * auVar61._0_4_;
        auVar62._4_4_ = auVar71._4_4_ * auVar61._4_4_;
        auVar62._8_4_ = auVar71._8_4_ * auVar61._8_4_;
        auVar62._12_4_ = auVar71._12_4_ * auVar61._12_4_;
        auVar62 = vfmsub231ps_fma(auVar62,auVar49,auVar56);
        auVar63._0_4_ = fVar4 * auVar62._0_4_;
        auVar63._4_4_ = fVar4 * auVar62._4_4_;
        auVar63._8_4_ = fVar4 * auVar62._8_4_;
        auVar63._12_4_ = fVar4 * auVar62._12_4_;
        auVar47 = vfmadd231ps_fma(auVar63,auVar116,auVar47);
        auVar63 = vfmadd231ps_fma(auVar47,auVar100,auVar87);
        local_1478 = auVar50._0_4_;
        fStack_1474 = auVar50._4_4_;
        fStack_1470 = auVar50._8_4_;
        fStack_146c = auVar50._12_4_;
        local_1458._0_4_ = auVar63._0_4_ + local_1478 + local_1468._0_4_;
        local_1458._4_4_ = auVar63._4_4_ + fStack_1474 + local_1468._4_4_;
        local_1458._8_4_ = auVar63._8_4_ + fStack_1470 + local_1468._8_4_;
        local_1458._12_4_ = auVar63._12_4_ + fStack_146c + local_1468._12_4_;
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar47 = vminps_avx(auVar50,local_1468);
        auVar87 = vminps_avx(auVar47,auVar63);
        auVar47 = vandps_avx(local_1458,auVar57);
        auVar95._0_4_ = auVar47._0_4_ * 1.1920929e-07;
        auVar95._4_4_ = auVar47._4_4_ * 1.1920929e-07;
        auVar95._8_4_ = auVar47._8_4_ * 1.1920929e-07;
        auVar95._12_4_ = auVar47._12_4_ * 1.1920929e-07;
        uVar27 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
        auVar88._0_8_ = uVar27 ^ 0x8000000080000000;
        auVar88._8_4_ = -auVar95._8_4_;
        auVar88._12_4_ = -auVar95._12_4_;
        auVar87 = vcmpps_avx(auVar87,auVar88,5);
        auVar62 = vmaxps_avx(auVar50,local_1468);
        auVar62 = vmaxps_avx(auVar62,auVar63);
        auVar62 = vcmpps_avx(auVar62,auVar95,2);
        auVar87 = vorps_avx(auVar87,auVar62);
        if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar87[0xf] < '\0') {
          auVar64._0_4_ = fVar111 * auVar98._0_4_;
          auVar64._4_4_ = fVar113 * auVar98._4_4_;
          auVar64._8_4_ = fVar114 * auVar98._8_4_;
          auVar64._12_4_ = fVar115 * auVar98._12_4_;
          auVar82._0_4_ = auVar91._0_4_ * fVar105;
          auVar82._4_4_ = auVar91._4_4_ * fVar108;
          auVar82._8_4_ = auVar91._8_4_ * fVar109;
          auVar82._12_4_ = auVar91._12_4_ * fVar110;
          auVar91 = vfmsub213ps_fma(auVar91,auVar68,auVar64);
          auVar89._0_4_ = auVar71._0_4_ * fVar12;
          auVar89._4_4_ = auVar71._4_4_ * fVar13;
          auVar89._8_4_ = auVar71._8_4_ * fVar14;
          auVar89._12_4_ = auVar71._12_4_ * fVar15;
          auVar96._0_4_ = auVar72._0_4_ * fVar105;
          auVar96._4_4_ = auVar72._4_4_ * fVar108;
          auVar96._8_4_ = auVar72._8_4_ * fVar109;
          auVar96._12_4_ = auVar72._12_4_ * fVar110;
          auVar72 = vfmsub213ps_fma(auVar72,auVar74,auVar89);
          auVar62 = vandps_avx(auVar64,auVar57);
          auVar63 = vandps_avx(auVar89,auVar57);
          auVar62 = vcmpps_avx(auVar62,auVar63,1);
          local_13f8 = vblendvps_avx(auVar72,auVar91,auVar62);
          auVar90._0_4_ = fVar111 * auVar49._0_4_;
          auVar90._4_4_ = fVar113 * auVar49._4_4_;
          auVar90._8_4_ = fVar114 * auVar49._8_4_;
          auVar90._12_4_ = fVar115 * auVar49._12_4_;
          auVar72 = vfmsub213ps_fma(auVar49,auVar68,auVar96);
          auVar65._0_4_ = auVar83._0_4_ * fVar12;
          auVar65._4_4_ = auVar83._4_4_ * fVar13;
          auVar65._8_4_ = auVar83._8_4_ * fVar14;
          auVar65._12_4_ = auVar83._12_4_ * fVar15;
          auVar91 = vfmsub213ps_fma(auVar98,auVar48,auVar65);
          auVar62 = vandps_avx(auVar65,auVar57);
          auVar63 = vandps_avx(auVar96,auVar57);
          auVar62 = vcmpps_avx(auVar62,auVar63,1);
          local_13e8 = vblendvps_avx(auVar72,auVar91,auVar62);
          auVar72 = vfmsub213ps_fma(auVar83,auVar74,auVar82);
          auVar71 = vfmsub213ps_fma(auVar71,auVar48,auVar90);
          auVar62 = vandps_avx(auVar82,auVar57);
          auVar63 = vandps_avx(auVar90,auVar57);
          auVar62 = vcmpps_avx(auVar62,auVar63,1);
          local_13d8 = vblendvps_avx(auVar71,auVar72,auVar62);
          auVar71._0_4_ = local_13d8._0_4_ * fVar4;
          auVar71._4_4_ = local_13d8._4_4_ * fVar4;
          auVar71._8_4_ = local_13d8._8_4_ * fVar4;
          auVar71._12_4_ = local_13d8._12_4_ * fVar4;
          auVar62 = vfmadd213ps_fma(auVar116,local_13e8,auVar71);
          auVar62 = vfmadd213ps_fma(auVar100,local_13f8,auVar62);
          auVar83._0_4_ = auVar62._0_4_ + auVar62._0_4_;
          auVar83._4_4_ = auVar62._4_4_ + auVar62._4_4_;
          auVar83._8_4_ = auVar62._8_4_ + auVar62._8_4_;
          auVar83._12_4_ = auVar62._12_4_ + auVar62._12_4_;
          auVar72._0_4_ = local_13d8._0_4_ * fVar19;
          auVar72._4_4_ = local_13d8._4_4_ * fVar9;
          auVar72._8_4_ = local_13d8._8_4_ * fVar10;
          auVar72._12_4_ = local_13d8._12_4_ * fVar11;
          auVar62 = vfmadd213ps_fma(auVar60,local_13e8,auVar72);
          auVar54 = vfmadd213ps_fma(auVar54,local_13f8,auVar62);
          auVar62 = vrcpps_avx(auVar83);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar60 = vfnmadd213ps_fma(auVar62,auVar83,auVar101);
          auVar62 = vfmadd132ps_fma(auVar60,auVar62,auVar62);
          local_1408._0_4_ = (auVar54._0_4_ + auVar54._0_4_) * auVar62._0_4_;
          local_1408._4_4_ = (auVar54._4_4_ + auVar54._4_4_) * auVar62._4_4_;
          local_1408._8_4_ = (auVar54._8_4_ + auVar54._8_4_) * auVar62._8_4_;
          local_1408._12_4_ = (auVar54._12_4_ + auVar54._12_4_) * auVar62._12_4_;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar91._4_4_ = uVar2;
          auVar91._0_4_ = uVar2;
          auVar91._8_4_ = uVar2;
          auVar91._12_4_ = uVar2;
          auVar62 = vcmpps_avx(auVar91,local_1408,2);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar102._4_4_ = uVar2;
          auVar102._0_4_ = uVar2;
          auVar102._8_4_ = uVar2;
          auVar102._12_4_ = uVar2;
          auVar84 = ZEXT1664(auVar102);
          auVar54 = vcmpps_avx(local_1408,auVar102,2);
          auVar62 = vandps_avx(auVar62,auVar54);
          auVar54 = auVar87 & auVar62;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar87 = vandps_avx(auVar62,auVar87);
            auVar62 = vcmpps_avx(auVar83,_DAT_01f7aa10,4);
            local_1438 = vandps_avx(auVar87,auVar62);
            uVar26 = vmovmskps_avx(local_1438);
            if (uVar26 != 0) {
              local_1448 = &mapUV;
              auVar87 = vrcpps_avx(local_1458);
              auVar66._8_4_ = 0x3f800000;
              auVar66._0_8_ = 0x3f8000003f800000;
              auVar66._12_4_ = 0x3f800000;
              auVar62 = vfnmadd213ps_fma(local_1458,auVar87,auVar66);
              auVar87 = vfmadd132ps_fma(auVar62,auVar87,auVar87);
              auVar58._8_4_ = 0x219392ef;
              auVar58._0_8_ = 0x219392ef219392ef;
              auVar58._12_4_ = 0x219392ef;
              auVar47 = vcmpps_avx(auVar47,auVar58,5);
              auVar47 = vandps_avx(auVar87,auVar47);
              auVar51._0_4_ = local_1478 * auVar47._0_4_;
              auVar51._4_4_ = fStack_1474 * auVar47._4_4_;
              auVar51._8_4_ = fStack_1470 * auVar47._8_4_;
              auVar51._12_4_ = fStack_146c * auVar47._12_4_;
              local_1428 = vminps_avx(auVar51,auVar66);
              auVar52._0_4_ = auVar47._0_4_ * local_1468._0_4_;
              auVar52._4_4_ = auVar47._4_4_ * local_1468._4_4_;
              auVar52._8_4_ = auVar47._8_4_ * local_1468._8_4_;
              auVar52._12_4_ = auVar47._12_4_ * local_1468._12_4_;
              local_1418 = vminps_avx(auVar52,auVar66);
              uVar27 = (ulong)(uVar26 & 0xff);
              do {
                uVar29 = 0;
                for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
                {
                  uVar29 = uVar29 + 1;
                }
                uVar26 = *(uint *)((long)&local_1488 + uVar29 * 4);
                pGVar7 = (pSVar6->geometries).items[uVar26].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005d37c4:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar46;
                  }
                  uVar30 = (ulong)(uint)((int)uVar29 * 4);
                  local_1398 = *(undefined4 *)(local_1428 + uVar30);
                  uVar2 = *(undefined4 *)(local_1418 + uVar30);
                  local_1388._4_4_ = uVar2;
                  local_1388._0_4_ = uVar2;
                  local_1388._8_4_ = uVar2;
                  local_1388._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar30);
                  args.context = context->user;
                  local_1368._4_4_ = uVar26;
                  local_1368._0_4_ = uVar26;
                  local_1368._8_4_ = uVar26;
                  local_1368._12_4_ = uVar26;
                  uVar2 = *(undefined4 *)((long)&local_1498 + uVar30);
                  local_1378._4_4_ = uVar2;
                  local_1378._0_4_ = uVar2;
                  local_1378._8_4_ = uVar2;
                  local_1378._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_13f8 + uVar30);
                  uVar5 = *(undefined4 *)(local_13e8 + uVar30);
                  local_13b8._4_4_ = uVar5;
                  local_13b8._0_4_ = uVar5;
                  local_13b8._8_4_ = uVar5;
                  local_13b8._12_4_ = uVar5;
                  uVar5 = *(undefined4 *)(local_13d8 + uVar30);
                  local_13a8._4_4_ = uVar5;
                  local_13a8._0_4_ = uVar5;
                  local_13a8._8_4_ = uVar5;
                  local_13a8._12_4_ = uVar5;
                  local_13c8[0] = (RTCHitN)(char)uVar2;
                  local_13c8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[4] = (RTCHitN)(char)uVar2;
                  local_13c8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[8] = (RTCHitN)(char)uVar2;
                  local_13c8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_13c8[0xc] = (RTCHitN)(char)uVar2;
                  local_13c8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_13c8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_13c8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_1394 = local_1398;
                  uStack_1390 = local_1398;
                  uStack_138c = local_1398;
                  vpcmpeqd_avx2(ZEXT1632(local_1368),ZEXT1632(local_1368));
                  uStack_1354 = (args.context)->instID[0];
                  local_1358 = uStack_1354;
                  uStack_1350 = uStack_1354;
                  uStack_134c = uStack_1354;
                  uStack_1348 = (args.context)->instPrimID[0];
                  uStack_1344 = uStack_1348;
                  uStack_1340 = uStack_1348;
                  uStack_133c = uStack_1348;
                  local_1518 = *local_14e0;
                  args.valid = (int *)local_1518;
                  args.geometryUserPtr = pGVar7->userPtr;
                  args.hit = local_13c8;
                  args.N = 4;
                  auVar47 = auVar84._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->occlusionFilterN)(&args);
                    auVar84 = ZEXT1664(auVar47);
                  }
                  if (local_1518 == (undefined1  [16])0x0) {
                    auVar47 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar47 = auVar47 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&args);
                      auVar84 = ZEXT1664(auVar47);
                    }
                    auVar87 = vpcmpeqd_avx(local_1518,_DAT_01f7aa10);
                    auVar47 = auVar87 ^ _DAT_01f7ae20;
                    auVar67._8_4_ = 0xff800000;
                    auVar67._0_8_ = 0xff800000ff800000;
                    auVar67._12_4_ = 0xff800000;
                    auVar87 = vblendvps_avx(auVar67,*(undefined1 (*) [16])(args.ray + 0x80),auVar87)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar87;
                  }
                  auVar59._8_8_ = 0x100000001;
                  auVar59._0_8_ = 0x100000001;
                  if ((auVar59 & auVar47) != (undefined1  [16])0x0) goto LAB_005d37c4;
                  *(int *)(ray + k * 4 + 0x80) = auVar84._0_4_;
                }
                uVar27 = uVar27 ^ 1L << (uVar29 & 0x3f);
              } while (uVar27 != 0);
            }
          }
        }
        local_14e8 = local_14e8 + 1;
        auVar84 = ZEXT3264(local_11f8);
        auVar92 = ZEXT3264(local_1218);
        auVar97 = ZEXT3264(local_1238);
        auVar112 = ZEXT3264(local_1318);
        auVar117 = ZEXT3264(local_1338);
      } while (local_14e8 != local_1500);
    }
LAB_005d37ae:
    bVar46 = local_14f0 != stack;
    if (!bVar46) {
      return bVar46;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }